

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O3

void __thiscall DBaseStatusBar::RefreshBackground(DBaseStatusBar *this)

{
  int iVar1;
  FTexture *pFVar2;
  int iVar3;
  uint uVar4;
  FTextureID FVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  float aspect;
  
  aspect = ActiveRatio((screen->super_DSimpleCanvas).super_DCanvas.Width,
                       (screen->super_DSimpleCanvas).super_DCanvas.Height,(float *)0x0);
  if ((aspect < 1.5) || (this->Scaled == false)) {
    uVar7 = *(uint *)&(this->super_DObject).field_0x24;
    uVar4 = uVar7;
  }
  else {
    iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    iVar3 = AspectMultiplier(aspect);
    uVar7 = ((0x30 - iVar3) * iVar1) / 0x60;
    uVar4 = *(uint *)&(this->super_DObject).field_0x24;
  }
  piVar6 = &this->ST_Y;
  if (uVar7 != uVar4) {
    piVar6 = &ST_Y;
  }
  if ((int)uVar7 < 1) {
    piVar6 = &ST_Y;
  }
  uVar4 = *piVar6;
  if (this->CompleteBorder == false) {
    if ((int)uVar4 < (screen->super_DSimpleCanvas).super_DCanvas.Height) {
      V_DrawBorder(uVar7 + 1,uVar4,(screen->super_DSimpleCanvas).super_DCanvas.Width,uVar4 + 1);
      iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
      V_DrawBorder(uVar7 + 1,iVar1 + -1,(screen->super_DSimpleCanvas).super_DCanvas.Width,iVar1);
    }
  }
  else {
    uVar7 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
  }
  if (0 < (int)uVar7) {
    if (this->CompleteBorder == false) {
      if ((aspect < 1.5) || (this->Scaled == false)) {
        uVar8 = this->HorizontalResolution + *(int *)&(this->super_DObject).field_0x24;
      }
      else {
        iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
        iVar3 = AspectMultiplier(aspect);
        iVar3 = (int)((ulong)((long)((0x30 - iVar3) * iVar1 + 0x5f) * -0x2aaaaaab) >> 0x20);
        uVar8 = ((iVar3 >> 4) - (iVar3 >> 0x1f)) + iVar1;
      }
    }
    else {
      uVar8 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    }
    V_DrawBorder(0,uVar4,uVar7 + 1,(screen->super_DSimpleCanvas).super_DCanvas.Height);
    V_DrawBorder(uVar8 - 1,uVar4,(screen->super_DSimpleCanvas).super_DCanvas.Width,
                 (screen->super_DSimpleCanvas).super_DCanvas.Height);
    if (9 < setblocks) {
      FVar5 = FTextureManager::GetTexture(&TexMan,gameinfo.Border.b.Chars,8,0);
      if ((-1 < FVar5.texnum) &&
         (pFVar2 = TexMan.Textures.Array[(uint)FVar5.texnum].Texture, pFVar2 != (FTexture *)0x0)) {
        (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
                  (screen,0,(ulong)uVar4,(ulong)uVar7,(ulong)(pFVar2->Height + uVar4),pFVar2,1);
        (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
                  (screen,(ulong)uVar8,(ulong)uVar4,
                   (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,
                   (ulong)(pFVar2->Height + uVar4),pFVar2,1);
      }
    }
  }
  return;
}

Assistant:

void DBaseStatusBar::RefreshBackground () const
{
	int x, x2, y;

	float ratio = ActiveRatio (SCREENWIDTH, SCREENHEIGHT);
	x = (ratio < 1.5f || !Scaled) ? ST_X : SCREENWIDTH*(48-AspectMultiplier(ratio))/(48*2);
	y = x == ST_X && x > 0 ? ST_Y : ::ST_Y;

	if(!CompleteBorder)
	{
		if(y < SCREENHEIGHT)
		{
			V_DrawBorder (x+1, y, SCREENWIDTH, y+1);
			V_DrawBorder (x+1, SCREENHEIGHT-1, SCREENWIDTH, SCREENHEIGHT);
		}
	}
	else
	{
		x = SCREENWIDTH;
	}

	if (x > 0)
	{
		if(!CompleteBorder)
		{
			x2 = ratio < 1.5f || !Scaled ? ST_X+HorizontalResolution :
				SCREENWIDTH - (SCREENWIDTH*(48-AspectMultiplier(ratio))+48*2-1)/(48*2);
		}
		else
		{
			x2 = SCREENWIDTH;
		}

		V_DrawBorder (0, y, x+1, SCREENHEIGHT);
		V_DrawBorder (x2-1, y, SCREENWIDTH, SCREENHEIGHT);

		if (setblocks >= 10)
		{
			FTexture *p = TexMan[gameinfo.Border.b];
			if (p != NULL)
			{
				screen->FlatFill(0, y, x, y + p->GetHeight(), p, true);
				screen->FlatFill(x2, y, SCREENWIDTH, y + p->GetHeight(), p, true);
			}
		}
	}
}